

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O2

void __thiscall
phmap::priv::anon_unknown_0::Table_IterationOrderChangesByInstance_Test::TestBody
          (Table_IterationOrderChangesByInstance_Test *this)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  AssertHelper local_e0;
  vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
  tables;
  raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  local_b8;
  int local_88 [4];
  vector<int,_std::allocator<int>_> reference;
  IntTable reference_table;
  
  local_88[0] = 2;
  local_88[1] = 6;
  local_88[2] = 0xc;
  local_88[3] = 0x14;
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 0x10) {
      return;
    }
    iVar1 = *(int *)((long)local_88 + lVar3);
    MakeSimpleTable(&reference_table,(long)iVar1);
    OrderOfIteration((vector<int,_std::allocator<int>_> *)
                     &reference.super__Vector_base<int,_std::allocator<int>_>,&reference_table);
    tables.
    super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tables.
    super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tables.
    super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar2 = false;
    for (uVar4 = 0; (bVar2 == false && (uVar4 < 5000)); uVar4 = uVar4 + 1) {
      MakeSimpleTable((IntTable *)&local_b8,(long)iVar1);
      std::
      vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
      ::push_back(&tables,(value_type *)&local_b8);
      raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
      ::~raw_hash_set(&local_b8);
      OrderOfIteration((vector<int,_std::allocator<int>_> *)&local_b8,
                       tables.
                       super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1);
      bVar2 = std::operator!=((vector<int,_std::allocator<int>_> *)&local_b8,
                              (vector<int,_std::allocator<int>_> *)
                              &reference.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_b8);
    }
    if (bVar2 == false) break;
    std::
    vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
    ::~vector(&tables);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&reference.super__Vector_base<int,_std::allocator<int>_>);
    raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
    ::~raw_hash_set(&reference_table.
                     super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                   );
    lVar3 = lVar3 + 4;
  }
  testing::Message::Message((Message *)&local_b8);
  std::operator<<((ostream *)((long)local_b8.ctrl_ + 0x10),
                  "Iteration order remained the same across many attempts with size ");
  std::ostream::_M_insert<unsigned_long>((ulong)((long)local_b8.ctrl_ + 0x10));
  testing::internal::AssertHelper::AssertHelper
            (&local_e0,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
             ,0x709,"Failed");
  testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_b8);
  testing::internal::AssertHelper::~AssertHelper(&local_e0);
  if ((long *)local_b8.ctrl_ != (long *)0x0) {
    (**(code **)(*(long *)local_b8.ctrl_ + 8))();
  }
  std::
  vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
  ::~vector(&tables);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&reference.super__Vector_base<int,_std::allocator<int>_>);
  raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  ::~raw_hash_set(&reference_table.
                   super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                 );
  return;
}

Assistant:

TEST(Table, IterationOrderChangesByInstance) {
  for (size_t size : {2, 6, 12, 20}) {
    const auto reference_table = MakeSimpleTable(size);
    const auto reference = OrderOfIteration(reference_table);

    std::vector<IntTable> tables;
    bool found_difference = false;
    for (int i = 0; !found_difference && i < 5000; ++i) {
      tables.push_back(MakeSimpleTable(size));
      found_difference = OrderOfIteration(tables.back()) != reference;
    }
    if (!found_difference) {
      FAIL()
          << "Iteration order remained the same across many attempts with size "
          << size;
    }
  }
}